

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_has_side(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_BOOL *has_side)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  ulong uVar6;
  REF_INT RVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  *has_side = 0;
  RVar7 = -1;
  uVar9 = 0xffffffff;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    uVar9 = 0xffffffff;
    RVar7 = -1;
    if (node0 < pRVar2->nnode) {
      uVar1 = pRVar2->first[(uint)node0];
      uVar9 = 0xffffffff;
      RVar7 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar7 = pRVar2->item[(int)uVar1].ref;
        uVar9 = (ulong)uVar1;
      }
    }
  }
  do {
    if ((int)uVar9 == -1) {
      return 0;
    }
    uVar1 = ref_cell->edge_per;
    if (ref_cell->edge_per < 1) {
      uVar1 = 0;
    }
    uVar6 = 0;
    while (uVar11 = uVar6, uVar1 != uVar11) {
      pRVar3 = ref_cell->e2n;
      pRVar4 = ref_cell->c2n;
      lVar8 = (long)ref_cell->size_per * (long)RVar7;
      lVar10 = (long)(int)lVar8;
      if (((pRVar4[lVar8 + pRVar3[uVar11 * 2]] == node0) &&
          (pRVar4[pRVar3[uVar11 * 2 + 1] + lVar10] == node1)) ||
         ((uVar6 = uVar11 + 1, pRVar4[lVar8 + pRVar3[uVar11 * 2]] == node1 &&
          (pRVar4[pRVar3[uVar11 * 2 + 1] + lVar10] == node0)))) {
        *has_side = 1;
        return 0;
      }
    }
    pRVar5 = ref_cell->ref_adj->item;
    uVar9 = (ulong)pRVar5[(int)uVar9].next;
    RVar7 = -1;
    if (uVar9 != 0xffffffffffffffff) {
      RVar7 = pRVar5[uVar9].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_has_side(REF_CELL ref_cell, REF_INT node0,
                                     REF_INT node1, REF_BOOL *has_side) {
  REF_INT item, cell;
  REF_INT cell_edge;

  *has_side = REF_FALSE;

  each_ref_adj_node_item_with_ref(ref_cell_adj(ref_cell), node0, item, cell)
      each_ref_cell_cell_edge(
          ref_cell,
          cell_edge) if ((node0 == ref_cell_e2n(ref_cell, 0, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 1, cell_edge, cell)) ||
                         (node0 == ref_cell_e2n(ref_cell, 1, cell_edge, cell) &&
                          node1 ==
                              ref_cell_e2n(ref_cell, 0, cell_edge, cell))) {
    *has_side = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}